

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O0

void dradb2(int ido,int l1,float *cc,float *ch,float *wa1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  float tr2;
  float ti2;
  int t6;
  int t5;
  int t4;
  int t3;
  int t2;
  int t1;
  int t0;
  int k;
  int i;
  float *wa1_local;
  float *ch_local;
  float *cc_local;
  int l1_local;
  int ido_local;
  
  iVar5 = l1 * ido;
  t3 = 0;
  t4 = 0;
  iVar6 = ido * 2 + -1;
  for (t1 = 0; t1 < l1; t1 = t1 + 1) {
    ch[t3] = cc[t4] + cc[iVar6 + t4];
    ch[t3 + iVar5] = cc[t4] - cc[iVar6 + t4];
    t3 = ido + t3;
    t4 = t3 * 2;
  }
  if (1 < ido) {
    if (ido != 2) {
      t3 = 0;
      t4 = 0;
      for (t1 = 0; t1 < l1; t1 = t1 + 1) {
        t5 = t3;
        t6 = t4;
        tr2 = (float)(iVar5 + t3);
        ti2 = (float)(t4 + ido * 2);
        for (t0 = 2; t0 < ido; t0 = t0 + 2) {
          iVar6 = t6 + 2;
          fVar7 = (float)((int)ti2 + -2);
          ch[t5 + 1] = cc[t6 + 1] + cc[(int)ti2 + -3];
          fVar1 = cc[t6 + 1];
          fVar2 = cc[(int)ti2 + -3];
          ch[t5 + 2] = cc[iVar6] - cc[(int)fVar7];
          fVar3 = cc[iVar6];
          fVar4 = cc[(int)fVar7];
          ch[(int)tr2 + 1] = wa1[t0 + -2] * (fVar1 - fVar2) + -(wa1[t0 + -1] * (fVar3 + fVar4));
          ch[(int)tr2 + 2] = wa1[t0 + -2] * (fVar3 + fVar4) + wa1[t0 + -1] * (fVar1 - fVar2);
          tr2 = (float)((int)tr2 + 2);
          ti2 = fVar7;
          t6 = iVar6;
          t5 = t5 + 2;
        }
        t3 = ido + t3;
        t4 = t3 * 2;
      }
      if (ido % 2 == 1) {
        return;
      }
    }
    t3 = ido + -1;
    t4 = ido + -1;
    for (t1 = 0; t1 < l1; t1 = t1 + 1) {
      ch[t3] = cc[t4] + cc[t4];
      ch[t3 + iVar5] = -(cc[t4 + 1] + cc[t4 + 1]);
      t3 = ido + t3;
      t4 = ido * 2 + t4;
    }
  }
  return;
}

Assistant:

static void dradb2(int ido,int l1,float *cc,float *ch,float *wa1){
  int i,k,t0,t1,t2,t3,t4,t5,t6;
  float ti2,tr2;

  t0=l1*ido;

  t1=0;
  t2=0;
  t3=(ido<<1)-1;
  for(k=0;k<l1;k++){
    ch[t1]=cc[t2]+cc[t3+t2];
    ch[t1+t0]=cc[t2]-cc[t3+t2];
    t2=(t1+=ido)<<1;
  }

  if(ido<2)return;
  if(ido==2)goto L105;

  t1=0;
  t2=0;
  for(k=0;k<l1;k++){
    t3=t1;
    t5=(t4=t2)+(ido<<1);
    t6=t0+t1;
    for(i=2;i<ido;i+=2){
      t3+=2;
      t4+=2;
      t5-=2;
      t6+=2;
      ch[t3-1]=cc[t4-1]+cc[t5-1];
      tr2=cc[t4-1]-cc[t5-1];
      ch[t3]=cc[t4]-cc[t5];
      ti2=cc[t4]+cc[t5];
      ch[t6-1]=wa1[i-2]*tr2-wa1[i-1]*ti2;
      ch[t6]=wa1[i-2]*ti2+wa1[i-1]*tr2;
    }
    t2=(t1+=ido)<<1;
  }

  if(ido%2==1)return;

L105:
  t1=ido-1;
  t2=ido-1;
  for(k=0;k<l1;k++){
    ch[t1]=cc[t2]+cc[t2];
    ch[t1+t0]=-(cc[t2+1]+cc[t2+1]);
    t1+=ido;
    t2+=ido<<1;
  }
}